

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledInputFile::readTiles
          (TiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  int *v;
  LineOrder LVar1;
  Data *pDVar2;
  InputStreamMutex *pIVar3;
  pointer ppTVar4;
  TileBuffer *pTVar5;
  Int64 IVar6;
  IStream *pIVar7;
  pointer ppTVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  Int64 *pIVar15;
  Int64 IVar16;
  undefined4 extraout_var_00;
  Task *this_00;
  InputExc *pIVar17;
  ostream *poVar18;
  ArgExc *pAVar19;
  IoExc *this_01;
  int iVar20;
  long lVar21;
  int dx;
  string *psVar22;
  string *psVar23;
  int dy;
  ulong uVar24;
  char *pcVar25;
  TaskGroup taskGroup;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  stringstream _iex_replace_s;
  undefined4 extraout_var;
  
  __iex_replace_s = this->_data->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar12 = isValidLevel(this,lx,ly);
  if (!bVar12) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar18 = std::operator<<(local_330,"Level coordinate (");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,lx);
    poVar18 = std::operator<<(poVar18,", ");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,ly);
    std::operator<<(poVar18,") is invalid.");
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iVar13 = dx2;
  if (dx1 < dx2) {
    iVar13 = dx1;
  }
  if (dx2 < dx1) {
    dx2 = dx1;
  }
  dy = dy2;
  if (dy1 < dy2) {
    dy = dy1;
  }
  if (dy2 < dy1) {
    dy2 = dy1;
  }
  LVar1 = pDVar2->lineOrder;
  iVar20 = dy + -1;
  if (LVar1 != DECREASING_Y) {
    iVar20 = dy2 + 1;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
  if (LVar1 == DECREASING_Y) {
    dy = dy2;
  }
  uVar24 = 0;
  do {
    if (dy == iVar20) {
      IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
      ppTVar4 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar8 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar22 = (string *)0x0;
      for (lVar21 = 0; (long)ppTVar8 - (long)ppTVar4 >> 3 != lVar21; lVar21 = lVar21 + 1) {
        pTVar5 = ppTVar4[lVar21];
        psVar23 = (string *)&pTVar5->exception;
        if (psVar22 != (string *)0x0) {
          psVar23 = psVar22;
        }
        if (pTVar5->hasException != false) {
          psVar22 = psVar23;
        }
        pTVar5->hasException = false;
      }
      if (psVar22 == (string *)0x0) {
        IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
        return;
      }
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_01,psVar22);
      __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
    }
    uVar24 = (ulong)(int)uVar24;
    for (dx = iVar13; dx <= dx2; dx = dx + 1) {
      bVar12 = isValidTile(this,dx,dy,lx,ly);
      if (!bVar12) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar18 = std::operator<<(local_330,"Tile (");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,dx);
        poVar18 = std::operator<<(poVar18,", ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,dy);
        poVar18 = std::operator<<(poVar18,", ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,lx);
        poVar18 = std::operator<<(poVar18,",");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,ly);
        std::operator<<(poVar18,") is not a valid tile.");
        pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pDVar2 = this->_data;
      pIVar3 = pDVar2->_streamData;
      ppTVar4 = (pDVar2->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar5 = ppTVar4[uVar24 % (ulong)((long)(pDVar2->tileBuffers).
                                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppTVar4 >> 3)];
      IlmThread_2_5::Semaphore::wait();
      pTVar5->dx = dx;
      pTVar5->dy = dy;
      pTVar5->lx = lx;
      pTVar5->ly = ly;
      pTVar5->uncompressedData = (char *)0x0;
      pIVar15 = TileOffsets::operator()(&pDVar2->tileOffsets,dx,dy,lx,ly);
      IVar6 = *pIVar15;
      if (IVar6 == 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar18 = std::operator<<(local_330,"Tile (");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,dx);
        poVar18 = std::operator<<(poVar18,", ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,dy);
        poVar18 = std::operator<<(poVar18,", ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,lx);
        poVar18 = std::operator<<(poVar18,", ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,ly);
        std::operator<<(poVar18,") is missing.");
        pIVar17 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar17,(stringstream *)&_iex_throw_s);
        __cxa_throw(pIVar17,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if ((pDVar2->version & 0x1000) == 0) {
        IVar16 = pIVar3->currentPosition;
      }
      else {
        iVar14 = (*pIVar3->is->_vptr_IStream[5])();
        IVar16 = CONCAT44(extraout_var,iVar14);
      }
      if (IVar16 != IVar6) {
        (*pIVar3->is->_vptr_IStream[6])(pIVar3->is,IVar6);
      }
      if (((pDVar2->version & 0x1000) != 0) &&
         ((*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&_iex_throw_s,4),
         __iex_throw_s != pDVar2->partNumber)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar18 = std::operator<<(local_330,"Unexpected part number ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,__iex_throw_s);
        poVar18 = std::operator<<(poVar18,", should be ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,pDVar2->partNumber);
        std::operator<<(poVar18,".");
        pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar19,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar19,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&_iex_throw_s,4);
      iVar14 = __iex_throw_s;
      (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&_iex_throw_s,4);
      iVar9 = __iex_throw_s;
      (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&_iex_throw_s,4);
      iVar10 = __iex_throw_s;
      (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&_iex_throw_s,4);
      iVar11 = __iex_throw_s;
      v = &pTVar5->dataSize;
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar3->is,v);
      if (dx != iVar14) {
        pcVar25 = "Unexpected tile x coordinate.";
LAB_003fc4aa:
        pIVar17 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar17,pcVar25);
        __cxa_throw(pIVar17,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (iVar9 != dy) {
        pcVar25 = "Unexpected tile y coordinate.";
        goto LAB_003fc4aa;
      }
      if (iVar10 != lx) {
        pcVar25 = "Unexpected tile x level number coordinate.";
        goto LAB_003fc4aa;
      }
      if (iVar11 != ly) {
        pcVar25 = "Unexpected tile y level number coordinate.";
        goto LAB_003fc4aa;
      }
      if ((*v < 0) || ((int)pDVar2->tileBufferSize < *v)) {
        pcVar25 = "Unexpected tile block length.";
        goto LAB_003fc4aa;
      }
      iVar14 = (*pIVar3->is->_vptr_IStream[2])();
      pIVar7 = pIVar3->is;
      if ((char)iVar14 == '\0') {
        (*pIVar7->_vptr_IStream[3])(pIVar7,pTVar5->buffer,(ulong)(uint)pTVar5->dataSize);
      }
      else {
        iVar14 = (*pIVar7->_vptr_IStream[4])(pIVar7,(ulong)(uint)*v);
        pTVar5->buffer = (char *)CONCAT44(extraout_var_00,iVar14);
      }
      pIVar3->currentPosition = (long)*v + IVar6 + 0x14;
      this_00 = (Task *)operator_new(0x20);
      IlmThread_2_5::Task::Task(this_00,&taskGroup);
      *(undefined ***)this_00 = &PTR__TileBufferTask_02f9cec0;
      *(Data **)(this_00 + 0x10) = pDVar2;
      *(TileBuffer **)(this_00 + 0x18) = pTVar5;
      IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
      uVar24 = uVar24 + 1;
    }
    dy = dy + (uint)(LVar1 != DECREASING_Y) * 2 + -1;
  } while( true );
}

Assistant:

void
TiledInputFile::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data destination.");
        
        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //
                               
        if (dx1 > dx2)
            std::swap (dx1, dx2);
        
        if (dy1 > dy2)
            std::swap (dy1, dy2);
        
        int dyStart = dy1;
	int dyStop  = dy2 + 1;
	int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
	// task group goes out of scope, the destructor waits until
	// all tasks are complete.
        //
        
        {
            TaskGroup taskGroup;
            int tileNumber = 0;
    
            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (IEX_NAMESPACE::ArgExc,
			       "Tile (" << dx << ", " << dy << ", " <<
			       lx << "," << ly << ") is not a valid tile.");
                    
                    ThreadPool::addGlobalTask (newTileBufferTask (&taskGroup,
                                                                  _data->_streamData,
                                                                  _data,
                                                                  tileNumber++,
                                                                  dx, dy,
                                                                  lx, ly));
                }
            }

	    //
            // finish all tasks
	    //
        }

	//
	// Exeption handling:
	//
	// TileBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to TiledInputFile::readTiles().
	// TileBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the tile buffers.
	// Now we check if any tile buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple tile buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
	{
            TileBuffer *tileBuffer = _data->tileBuffers[i];

	    if (tileBuffer->hasException && !exception)
		exception = &tileBuffer->exception;

	    tileBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}